

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  undefined8 uVar1;
  ImVec2 IVar2;
  ImDrawVert *pIVar3;
  int iVar4;
  ImVec2 IVar5;
  ulong uVar6;
  ImDrawIdx IVar7;
  float *pfVar8;
  ulong uVar9;
  undefined8 *puVar10;
  ImDrawIdx IVar11;
  long lVar12;
  long lVar13;
  ImDrawIdx IVar14;
  ImDrawIdx IVar15;
  int iVar16;
  undefined7 in_register_00000081;
  ulong uVar17;
  ImDrawIdx *pIVar18;
  uint uVar19;
  ImDrawIdx IVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float afStack_78 [2];
  undefined8 uStack_70;
  ImVec2 local_68;
  ImVec2 IStack_60;
  ImVec2 local_58;
  ImVec2 IStack_50;
  undefined8 local_48;
  float *local_40;
  ImU32 local_34;
  
  if (points_count < 2) {
    return;
  }
  IVar2 = this->_Data->TexUvWhitePixel;
  local_58 = (ImVec2)(ulong)(points_count - 1U);
  local_40 = (float *)(ulong)(points_count - 1U);
  if (closed) {
    local_40 = (float *)(ulong)(uint)points_count;
  }
  iVar16 = (int)local_40;
  local_68.x = thickness;
  if ((this->Flags & 1) == 0) {
    uStack_70 = 0x155c66;
    PrimReserve(this,iVar16 * 6,iVar16 * 4);
    for (uVar9 = 1; uVar9 - ((ulong)local_40 & 0xffffffff) != 1; uVar9 = uVar9 + 1) {
      uVar6 = uVar9 & 0xffffffff;
      if ((uint)points_count == uVar9) {
        uVar6 = 0;
      }
      fVar24 = points[uVar9 - 1].x;
      fVar26 = points[uVar9 - 1].y;
      fVar22 = points[uVar6].x - fVar24;
      fVar25 = points[uVar6].y - fVar26;
      fVar23 = fVar22 * fVar22 + fVar25 * fVar25;
      if (0.0 < fVar23) {
        fVar23 = 1.0 / SQRT(fVar23);
        fVar25 = fVar25 * fVar23;
        fVar22 = fVar22 * fVar23;
      }
      fVar25 = fVar25 * local_68.x * 0.5;
      fVar22 = fVar22 * local_68.x * 0.5;
      pIVar3 = this->_VtxWritePtr;
      IVar5.y = fVar26 - fVar22;
      IVar5.x = fVar24 + fVar25;
      pIVar3->pos = IVar5;
      pIVar3->uv = IVar2;
      pIVar3 = this->_VtxWritePtr;
      pIVar3->col = col;
      pIVar3[1].pos.x = points[uVar6].x + fVar25;
      pIVar3[1].pos.y = points[uVar6].y - fVar22;
      pIVar3[1].uv = IVar2;
      pIVar3 = this->_VtxWritePtr;
      pIVar3[1].col = col;
      pIVar3[2].pos.x = points[uVar6].x - fVar25;
      pIVar3[2].pos.y = points[uVar6].y + fVar22;
      pIVar3[2].uv = IVar2;
      pIVar3 = this->_VtxWritePtr;
      pIVar3[2].col = col;
      pIVar3[3].pos.x = points[uVar9 - 1].x - fVar25;
      pIVar3[3].pos.y = points[uVar9 - 1].y + fVar22;
      pIVar3[3].uv = IVar2;
      pIVar3 = this->_VtxWritePtr;
      pIVar3[3].col = col;
      this->_VtxWritePtr = pIVar3 + 4;
      uVar19 = this->_VtxCurrentIdx;
      pIVar18 = this->_IdxWritePtr;
      IVar14 = (ImDrawIdx)uVar19;
      *pIVar18 = IVar14;
      pIVar18[1] = IVar14 + 1;
      pIVar18[2] = IVar14 + 2;
      pIVar18[3] = IVar14;
      pIVar18[4] = IVar14 + 2;
      pIVar18[5] = IVar14 + 3;
      this->_IdxWritePtr = pIVar18 + 6;
      this->_VtxCurrentIdx = uVar19 + 4;
    }
    return;
  }
  local_34 = (ImU32)CONCAT71(in_register_00000081,closed);
  local_48 = (ulong)(1.0 < thickness);
  iVar4 = 0xc;
  if (1.0 < thickness) {
    iVar4 = 0x12;
  }
  IStack_50.y = (float)(points_count * 3);
  if (1.0 < thickness) {
    IStack_50.y = (float)(points_count * 4);
  }
  uStack_70 = 0x155e27;
  PrimReserve(this,iVar4 * iVar16,(int)IStack_50.y);
  lVar13 = -((ulong)(uint)(((int)local_48 * 2 + 3) * points_count) * 8 + 0xf & 0xfffffffffffffff0);
  puVar10 = (undefined8 *)((long)&local_68 + lVar13);
  uVar6 = (ulong)(uint)points_count;
  lVar12 = -((ulong)local_40 & 0xffffffff);
  *(undefined8 *)((long)&uStack_70 + lVar13) = 1;
  for (uVar9 = *(ulong *)((long)&uStack_70 + lVar13); lVar12 + uVar9 != 1; uVar9 = uVar9 + 1) {
    uVar17 = uVar9 & 0xffffffff;
    if (uVar6 == uVar9) {
      uVar17 = 0;
    }
    fVar25 = points[uVar17].x - points[uVar9 - 1].x;
    fVar22 = points[uVar17].y - points[uVar9 - 1].y;
    fVar24 = fVar25 * fVar25 + fVar22 * fVar22;
    if (0.0 < fVar24) {
      fVar24 = 1.0 / SQRT(fVar24);
      fVar25 = fVar25 * fVar24;
      fVar22 = fVar22 * fVar24;
    }
    *(float *)((long)&uStack_70 + uVar9 * 8 + lVar13) = fVar22;
    *(float *)((long)&uStack_70 + uVar9 * 8 + lVar13 + 4) = -fVar25;
  }
  pfVar8 = (float *)(puVar10 + uVar6);
  local_40 = pfVar8;
  local_48 = CONCAT44(local_48._4_4_,col) & 0xffffffff00ffffff;
  if ((char)local_34 == '\0') {
    *(undefined8 *)(pfVar8 + -2) = *(undefined8 *)(pfVar8 + -4);
    if (1.0 < local_68.x) {
      local_34 = col;
      fVar30 = (local_68.x + -1.0) * 0.5;
      fVar25 = fVar30 + 1.0;
      fVar22 = (float)*puVar10;
      fVar24 = (float)((ulong)*puVar10 >> 0x20);
      fVar26 = fVar22 * fVar25;
      fVar23 = fVar24 * fVar25;
      fVar27 = (*points).x;
      fVar28 = (*points).y;
      fVar22 = fVar22 * fVar30;
      fVar24 = fVar24 * fVar30;
      *pfVar8 = fVar26 + fVar27;
      pfVar8[1] = fVar23 + fVar28;
      pfVar8[2] = fVar22 + fVar27;
      pfVar8[3] = fVar24 + fVar28;
      pfVar8[4] = fVar27 - fVar22;
      pfVar8[5] = fVar28 - fVar24;
      pfVar8[6] = fVar27 - fVar26;
      pfVar8[7] = fVar28 - fVar23;
      uVar9 = (ulong)local_58 & 0xffffffff;
      fVar22 = points[uVar9].x;
      fVar24 = points[uVar9].y;
      uVar17 = (ulong)(uint)((int)local_58.x << 2);
      *(ulong *)(pfVar8 + uVar17 * 2) =
           CONCAT44((float)((ulong)puVar10[uVar9] >> 0x20) * fVar25 + fVar24,
                    (float)puVar10[uVar9] * fVar25 + fVar22);
      *(ulong *)(pfVar8 + uVar17 * 2 + 2) =
           CONCAT44((float)((ulong)puVar10[uVar9] >> 0x20) * fVar30 + fVar24,
                    (float)puVar10[uVar9] * fVar30 + fVar22);
      *(ulong *)(pfVar8 + uVar17 * 2 + 4) =
           CONCAT44(fVar24 - (float)((ulong)puVar10[uVar9] >> 0x20) * fVar30,
                    fVar22 - (float)puVar10[uVar9] * fVar30);
      *(ulong *)(pfVar8 + uVar17 * 2 + 6) =
           CONCAT44(fVar24 - (float)((ulong)puVar10[uVar9] >> 0x20) * fVar25,
                    fVar22 - (float)puVar10[uVar9] * fVar25);
      goto LAB_00156000;
    }
    fVar25 = (float)*puVar10;
    fVar22 = (float)((ulong)*puVar10 >> 0x20);
    fVar24 = (*points).x;
    fVar26 = (*points).y;
    *pfVar8 = fVar25 + fVar24;
    pfVar8[1] = fVar22 + fVar26;
    pfVar8[2] = fVar24 - fVar25;
    pfVar8[3] = fVar26 - fVar22;
    uVar9 = (ulong)local_58 & 0xffffffff;
    fVar25 = points[uVar9].x;
    fVar22 = points[uVar9].y;
    uVar17 = (ulong)(uint)((int)local_58.x * 2);
    *(ulong *)(pfVar8 + uVar17 * 2) =
         CONCAT44((float)((ulong)puVar10[uVar9] >> 0x20) + fVar22,(float)puVar10[uVar9] + fVar25);
    *(ulong *)(pfVar8 + uVar17 * 2 + 2) =
         CONCAT44(fVar22 - (float)((ulong)puVar10[uVar9] >> 0x20),fVar25 - (float)puVar10[uVar9]);
  }
  else if (1.0 < local_68.x) {
    local_34 = col;
    fVar30 = (local_68.x + -1.0) * 0.5;
    fVar25 = fVar30 + 1.0;
LAB_00156000:
    uVar19 = this->_VtxCurrentIdx;
    pIVar18 = this->_IdxWritePtr;
    *(undefined8 *)((long)&uStack_70 + lVar13) = 1;
    for (uVar9 = *(ulong *)((long)&uStack_70 + lVar13); lVar12 + uVar9 != 1; uVar9 = uVar9 + 1) {
      uVar17 = uVar9 & 0xffffffff;
      if (uVar6 == uVar9) {
        uVar17 = 0;
      }
      uVar21 = uVar19 + 4;
      if (uVar6 == uVar9) {
        uVar21 = this->_VtxCurrentIdx;
      }
      uVar1 = *(undefined8 *)((long)&uStack_70 + uVar9 * 8 + lVar13);
      fVar24 = ((float)puVar10[uVar17] + (float)uVar1) * 0.5;
      fVar26 = ((float)((ulong)puVar10[uVar17] >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
      fVar23 = fVar24 * fVar24 + fVar26 * fVar26;
      fVar22 = 0.5;
      if (0.5 <= fVar23) {
        fVar22 = fVar23;
      }
      fVar22 = 1.0 / fVar22;
      fVar28 = points[uVar17].x;
      fVar29 = points[uVar17].y;
      uVar17 = (ulong)(uint)((int)uVar17 << 2);
      fVar23 = fVar24 * fVar22 * fVar25;
      fVar27 = fVar26 * fVar22 * fVar25;
      fVar24 = fVar24 * fVar22 * fVar30;
      fVar22 = fVar26 * fVar22 * fVar30;
      pfVar8 = local_40 + uVar17 * 2;
      *pfVar8 = fVar28 + fVar23;
      pfVar8[1] = fVar29 + fVar27;
      pfVar8[2] = fVar28 + fVar24;
      pfVar8[3] = fVar29 + fVar22;
      pfVar8 = local_40 + uVar17 * 2 + 4;
      *pfVar8 = fVar28 - fVar24;
      pfVar8[1] = fVar29 - fVar22;
      pfVar8[2] = fVar28 - fVar23;
      pfVar8[3] = fVar29 - fVar27;
      IVar14 = (ImDrawIdx)uVar21;
      IVar15 = IVar14 + 1;
      *pIVar18 = IVar15;
      IVar20 = (ImDrawIdx)uVar19;
      pIVar18[1] = IVar20 + 1;
      IVar7 = IVar20 + 2;
      pIVar18[2] = IVar7;
      pIVar18[3] = IVar7;
      IVar11 = IVar14 + 2;
      pIVar18[4] = IVar11;
      pIVar18[5] = IVar15;
      pIVar18[6] = IVar15;
      pIVar18[7] = IVar20 + 1;
      pIVar18[8] = IVar20;
      pIVar18[9] = IVar20;
      pIVar18[10] = IVar14;
      pIVar18[0xb] = IVar15;
      pIVar18[0xc] = IVar11;
      pIVar18[0xd] = IVar7;
      pIVar18[0xe] = IVar20 + 3;
      pIVar18[0xf] = IVar20 + 3;
      pIVar18[0x10] = IVar14 + 3;
      pIVar18[0x11] = IVar11;
      pIVar18 = pIVar18 + 0x12;
      this->_IdxWritePtr = pIVar18;
      uVar19 = uVar21;
    }
    for (lVar13 = 0; uVar6 * 0x20 != lVar13; lVar13 = lVar13 + 0x20) {
      this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar10 + lVar13 + uVar6 * 8);
      this->_VtxWritePtr->uv = IVar2;
      pIVar3 = this->_VtxWritePtr;
      pIVar3->col = (ImU32)local_48;
      pIVar3[1].pos = *(ImVec2 *)((long)puVar10 + lVar13 + uVar6 * 8 + 8);
      this->_VtxWritePtr[1].uv = IVar2;
      pIVar3 = this->_VtxWritePtr;
      pIVar3[1].col = local_34;
      pIVar3[2].pos = *(ImVec2 *)((long)puVar10 + lVar13 + uVar6 * 8 + 0x10);
      this->_VtxWritePtr[2].uv = IVar2;
      pIVar3 = this->_VtxWritePtr;
      pIVar3[2].col = local_34;
      pIVar3[3].pos = *(ImVec2 *)((long)puVar10 + lVar13 + uVar6 * 8 + 0x18);
      this->_VtxWritePtr[3].uv = IVar2;
      pIVar3 = this->_VtxWritePtr;
      pIVar3[3].col = (ImU32)local_48;
      this->_VtxWritePtr = pIVar3 + 4;
    }
    goto LAB_00156392;
  }
  uVar19 = this->_VtxCurrentIdx;
  pIVar18 = this->_IdxWritePtr;
  *(undefined8 *)((long)&uStack_70 + lVar13) = 1;
  for (uVar9 = *(ulong *)((long)&uStack_70 + lVar13); lVar12 + uVar9 != 1; uVar9 = uVar9 + 1) {
    uVar17 = uVar9 & 0xffffffff;
    uVar21 = uVar19 + 3;
    if (uVar6 == uVar9) {
      uVar17 = 0;
      uVar21 = this->_VtxCurrentIdx;
    }
    uVar1 = *(undefined8 *)((long)&uStack_70 + uVar9 * 8 + lVar13);
    fVar22 = ((float)puVar10[uVar17] + (float)uVar1) * 0.5;
    fVar24 = ((float)((ulong)puVar10[uVar17] >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
    fVar26 = fVar22 * fVar22 + fVar24 * fVar24;
    fVar25 = 0.5;
    if (0.5 <= fVar26) {
      fVar25 = fVar26;
    }
    fVar22 = (1.0 / fVar25) * fVar22;
    fVar24 = (1.0 / fVar25) * fVar24;
    fVar25 = points[uVar17].x;
    fVar26 = points[uVar17].y;
    pfVar8 = pfVar8 + (ulong)(uint)((int)uVar17 * 2) * 2;
    *pfVar8 = fVar22 + fVar25;
    pfVar8[1] = fVar24 + fVar26;
    pfVar8[2] = fVar25 - fVar22;
    pfVar8[3] = fVar26 - fVar24;
    IVar20 = (ImDrawIdx)uVar21;
    *pIVar18 = IVar20;
    IVar14 = (ImDrawIdx)uVar19;
    pIVar18[1] = IVar14;
    pIVar18[2] = IVar14 + 2;
    pIVar18[3] = IVar14 + 2;
    pIVar18[4] = IVar20 + 2;
    pIVar18[5] = IVar20;
    pIVar18[6] = IVar20 + 1;
    pIVar18[7] = IVar14 + 1;
    pIVar18[8] = IVar14;
    pIVar18[9] = IVar14;
    pIVar18[10] = IVar20;
    pIVar18[0xb] = IVar20 + 1;
    pIVar18 = pIVar18 + 0xc;
    this->_IdxWritePtr = pIVar18;
    pfVar8 = local_40;
    uVar19 = uVar21;
  }
  for (lVar13 = 0; uVar6 * 8 - lVar13 != 0; lVar13 = lVar13 + 8) {
    this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar13);
    this->_VtxWritePtr->uv = IVar2;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = col;
    pIVar3[1].pos = *(ImVec2 *)((long)puVar10 + lVar13 * 2 + uVar6 * 8);
    this->_VtxWritePtr[1].uv = IVar2;
    pIVar3 = this->_VtxWritePtr;
    pIVar3[1].col = (ImU32)local_48;
    pIVar3[2].pos = *(ImVec2 *)((long)puVar10 + lVar13 * 2 + uVar6 * 8 + 8);
    this->_VtxWritePtr[2].uv = IVar2;
    pIVar3 = this->_VtxWritePtr;
    pIVar3[2].col = (ImU32)local_48;
    this->_VtxWritePtr = pIVar3 + 3;
  }
LAB_00156392:
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)IStack_50.y._0_2_;
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = thickness > 1.0f;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y)
                dm_x *= AA_SIZE;
                dm_y *= AA_SIZE;

                // Add temporary vertexes
                ImVec2* out_vtx = &temp_points[i2*2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+0] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+1] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+2] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+3] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+4;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertexes
                ImVec2* out_vtx = &temp_points[i2*4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1+2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2+2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1+0); _IdxWritePtr[10] = (ImDrawIdx)(idx2+0); _IdxWritePtr[11] = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2+2); _IdxWritePtr[13] = (ImDrawIdx)(idx1+2); _IdxWritePtr[14] = (ImDrawIdx)(idx1+3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1+3); _IdxWritePtr[16] = (ImDrawIdx)(idx2+3); _IdxWritePtr[17] = (ImDrawIdx)(idx2+2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i*4+0]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i*4+1]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i*4+2]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i*4+3]; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}